

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O3

FieldGenerator *
google::protobuf::compiler::cpp::FieldGeneratorMap::MakeGenerator
          (FieldDescriptor *field,Options *options)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  RepeatedMessageFieldGenerator *this;
  
  uVar1 = *(uint *)(field + 0x2c);
  iVar2 = *(int *)(field + 0x30);
  this = (RepeatedMessageFieldGenerator *)operator_new(0x40);
  iVar3 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)uVar1 * 4);
  if (iVar2 == 3) {
    if (iVar3 == 8) {
      RepeatedEnumFieldGenerator::RepeatedEnumFieldGenerator
                ((RepeatedEnumFieldGenerator *)this,field,options);
    }
    else if (iVar3 == 9) {
      RepeatedStringFieldGenerator::RepeatedStringFieldGenerator
                ((RepeatedStringFieldGenerator *)this,field,options);
    }
    else if (iVar3 == 10) {
      RepeatedMessageFieldGenerator::RepeatedMessageFieldGenerator(this,field,options);
    }
    else {
      RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator
                ((RepeatedPrimitiveFieldGenerator *)this,field,options);
    }
  }
  else if (iVar3 == 8) {
    EnumFieldGenerator::EnumFieldGenerator((EnumFieldGenerator *)this,field,options);
  }
  else if (iVar3 == 9) {
    StringFieldGenerator::StringFieldGenerator((StringFieldGenerator *)this,field,options);
  }
  else if (iVar3 == 10) {
    MessageFieldGenerator::MessageFieldGenerator((MessageFieldGenerator *)this,field,options);
  }
  else {
    PrimitiveFieldGenerator::PrimitiveFieldGenerator((PrimitiveFieldGenerator *)this,field,options);
  }
  return &this->super_FieldGenerator;
}

Assistant:

FieldGenerator* FieldGeneratorMap::MakeGenerator(const FieldDescriptor* field,
                                                 const Options& options) {
  if (field->is_repeated()) {
    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_MESSAGE:
        return new RepeatedMessageFieldGenerator(field, options);
      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // RepeatedStringFieldGenerator handles unknown ctypes.
          case FieldOptions::STRING:
            return new RepeatedStringFieldGenerator(field, options);
        }
      case FieldDescriptor::CPPTYPE_ENUM:
        return new RepeatedEnumFieldGenerator(field, options);
      default:
        return new RepeatedPrimitiveFieldGenerator(field, options);
    }
  } else {
    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_MESSAGE:
        return new MessageFieldGenerator(field, options);
      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // StringFieldGenerator handles unknown ctypes.
          case FieldOptions::STRING:
            return new StringFieldGenerator(field, options);
        }
      case FieldDescriptor::CPPTYPE_ENUM:
        return new EnumFieldGenerator(field, options);
      default:
        return new PrimitiveFieldGenerator(field, options);
    }
  }
}